

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O3

void Frc_ManPlacementRefine(Frc_Man_t *p,int nIters,int fVerbose)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *vCoOrder;
  int *piVar5;
  float *pArray;
  int iVar6;
  long lVar7;
  long lVar8;
  uint *puVar9;
  size_t __size;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  float fVar17;
  int nCutCur2;
  timespec ts;
  uint local_74;
  timespec local_70;
  int local_5c;
  long local_58;
  int *local_50;
  double local_48;
  double local_40;
  long local_38;
  
  local_5c = fVerbose;
  iVar3 = clock_gettime(3,&local_70);
  if (iVar3 < 0) {
    local_58 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
    local_58 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_70.tv_sec * -1000000;
  }
  vCoOrder = Frc_ManCollectCos(p);
  iVar3 = Frc_ManPlaceDfsBoth(p,vCoOrder,(int *)&local_74);
  __size = (long)p->nObjs << 2;
  piVar5 = (int *)malloc(__size);
  pArray = (float *)malloc(__size);
  if (0 < nIters) {
    local_48 = (double)iVar3;
    lVar8 = 0;
    iVar10 = 0;
    local_50 = piVar5;
    do {
      iVar4 = p->nObjData;
      if (iVar4 < 1) {
        local_40 = 0.0;
LAB_00710fae:
        lVar15 = 0;
      }
      else {
        puVar9 = (uint *)p->pObjData;
        local_40 = 0.0;
        if (puVar9 != (uint *)0x0) {
          iVar6 = 0;
          do {
            uVar13 = puVar9[4];
            uVar1 = puVar9[1];
            uVar12 = uVar13;
            if (0 < (long)(int)uVar1) {
              lVar15 = 0;
              uVar11 = uVar13;
              do {
                uVar12 = puVar9[(long)(int)puVar9[(ulong)(*puVar9 >> 4) + lVar15 + 6] + 4];
                if ((int)uVar12 <= (int)uVar13) {
                  uVar13 = uVar12;
                }
                if ((int)uVar12 < (int)uVar11) {
                  uVar12 = uVar11;
                }
                lVar15 = lVar15 + 1;
                uVar11 = uVar12;
              } while ((int)uVar1 != lVar15);
            }
            puVar9[5] = (uint)((float)(int)(uVar12 + uVar13) * 0.5);
            local_40 = local_40 + (double)(int)(uVar12 - uVar13);
            iVar6 = iVar6 + uVar1 + (*puVar9 >> 4) + 6;
            iVar4 = p->nObjData;
          } while ((iVar6 < iVar4) &&
                  (puVar9 = (uint *)(p->pObjData + iVar6), p->pObjData != (int *)0x0));
        }
        if (iVar4 < 1) goto LAB_00710fae;
        piVar2 = p->pObjData;
        lVar15 = 0;
        iVar6 = 0;
        do {
          if (piVar2 == (int *)0x0) break;
          puVar9 = (uint *)(piVar2 + iVar6);
          fVar17 = (float)puVar9[5];
          uVar13 = *puVar9 >> 4;
          if (0xf < *puVar9) {
            uVar14 = 0;
            do {
              fVar17 = fVar17 + (float)puVar9[5 - (long)(int)puVar9[uVar14 + 6]];
              uVar14 = uVar14 + 1;
            } while (uVar13 != uVar14);
          }
          pArray[lVar15] = fVar17 / (float)(uVar13 + 1);
          piVar5[lVar15] = iVar6;
          lVar15 = lVar15 + 1;
          iVar6 = puVar9[1] + (*puVar9 >> 4) + iVar6 + 6;
        } while (iVar6 < iVar4);
      }
      if ((int)lVar15 != p->nObjs) {
        __assert_fail("Counter == Frc_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaForce.c"
                      ,0x3a3,"void Frc_ManPlacementRefine(Frc_Man_t *, int, int)");
      }
      iVar4 = clock_gettime(3,&local_70);
      if (iVar4 < 0) {
        lVar15 = 1;
      }
      else {
        lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
        lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_70.tv_sec * -1000000;
      }
      local_38 = lVar8;
      piVar5 = Gia_SortFloats(pArray,piVar5,p->nObjs);
      iVar4 = clock_gettime(3,&local_70);
      if (iVar4 < 0) {
        lVar8 = -1;
      }
      else {
        lVar8 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
      }
      if (piVar5 != local_50) {
        __assert_fail("pPermX == pHandles",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaForce.c"
                      ,0x3a8,"void Frc_ManPlacementRefine(Frc_Man_t *, int, int)");
      }
      vCoOrder->nSize = 0;
      iVar4 = p->nObjs;
      if (0 < iVar4) {
        lVar16 = 0;
        do {
          lVar7 = (long)piVar5[lVar16];
          piVar2 = p->pObjData;
          piVar2[lVar7 + 4] = (int)lVar16;
          if ((*(byte *)(piVar2 + lVar7) & 2) != 0) {
            Vec_IntPush(vCoOrder,piVar2[lVar7 + 3]);
            iVar4 = p->nObjs;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < iVar4);
      }
      lVar8 = local_38 + lVar15 + lVar8;
      uVar13 = Frc_ManPlaceDfsBoth(p,vCoOrder,(int *)&local_74);
      piVar5 = local_50;
      iVar10 = iVar10 + 1;
      if (local_5c != 0) {
        printf("%2d : Span = %e  ",local_40);
        iVar4 = 0x9ff69a;
        printf("Cut = %6d  (%5.2f %%)  CutR = %6d  ",
               ((double)(int)(iVar3 - uVar13) * 100.0) / local_48,(ulong)uVar13,(ulong)local_74);
        Abc_Print(iVar4,"%s =","Total");
        iVar6 = 3;
        iVar4 = clock_gettime(3,&local_70);
        if (iVar4 < 0) {
          lVar15 = -1;
        }
        else {
          lVar15 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
        }
        Abc_Print(iVar6,"%9.2f sec  ",(double)(lVar15 + local_58) / 1000000.0);
        Abc_Print(iVar6,"%s =","Sort");
        Abc_Print(iVar6,"%9.2f sec\n",(double)lVar8 / 1000000.0);
      }
    } while (iVar10 != nIters);
  }
  if (piVar5 != (int *)0x0) {
    free(piVar5);
  }
  if (pArray != (float *)0x0) {
    free(pArray);
  }
  if (vCoOrder->pArray != (int *)0x0) {
    free(vCoOrder->pArray);
  }
  free(vCoOrder);
  return;
}

Assistant:

void Frc_ManPlacementRefine( Frc_Man_t * p, int nIters, int fVerbose )
{
    int fRandomize = 0;
    Vec_Int_t * vCoOrder;
    Frc_Obj_t * pThis, * pNext;
    double CostThis, CostPrev;
    float * pVertX, VertX;
    int * pPermX, * pHandles;
    int k, h, Iter, iMinX, iMaxX, Counter, nCutStart, nCutCur, nCutCur2, nCutPrev;
    abctime clk = Abc_Clock(), clk2, clk2Total = 0;
    // create starting one-dimensional placement
    vCoOrder = Frc_ManCollectCos( p );
    if ( fRandomize )
        Frc_ManArrayShuffle( vCoOrder );
    nCutStart = Frc_ManPlaceDfsBoth( p, vCoOrder, &nCutCur2 );
    // refine placement
    CostPrev = 0.0;
    nCutPrev = nCutStart;
    pHandles = ABC_ALLOC( int, p->nObjs );
    pVertX   = ABC_ALLOC( float, p->nObjs );
    for ( Iter = 0; Iter < nIters; Iter++ )
    {
        // compute centers of hyperedges
        CostThis = 0.0;
        Frc_ManForEachObj( p, pThis, h )
        {
            iMinX = iMaxX = pThis->pPlace;
            Frc_ObjForEachFanout( pThis, pNext, k )
            {
                iMinX = Abc_MinInt( iMinX, pNext->pPlace );
                iMaxX = Abc_MaxInt( iMaxX, pNext->pPlace );
            }
            pThis->fEdgeCenter = 0.5 * (iMaxX + iMinX);
            CostThis += (iMaxX - iMinX);
        }
        // compute new centers of objects
        Counter = 0;
        Frc_ManForEachObj( p, pThis, h )
        {
            VertX = pThis->fEdgeCenter;
            Frc_ObjForEachFanin( pThis, pNext, k )
                VertX += pNext->fEdgeCenter;
            pVertX[Counter] = VertX / (Frc_ObjFaninNum(pThis) + 1);
            pHandles[Counter++] = h;
        }
        assert( Counter == Frc_ManObjNum(p) );
        // sort these numbers
        clk2 = Abc_Clock();
        pPermX = Gia_SortFloats( pVertX, pHandles, p->nObjs );
        clk2Total += Abc_Clock() - clk2;
        assert( pPermX == pHandles );
        Vec_IntClear( vCoOrder );
        for ( k = 0; k < p->nObjs; k++ )
        {
            pThis = Frc_ManObj( p, pPermX[k] );
            pThis->pPlace = k;
            if ( Frc_ObjIsCo(pThis) )
                Vec_IntPush( vCoOrder, pThis->hHandle );
        }
/*
        printf( "Ordering of PIs:\n" );
        Frc_ManForEachCi( p, pThis, k )
            printf( "PI number = %7d.  Object handle = %7d,  Coordinate = %7d.\n", 
                k, pThis->hHandle, pThis->pPlace );
*/
        nCutCur = Frc_ManPlaceDfsBoth( p, vCoOrder, &nCutCur2 );
        // evaluate cost
        if ( fVerbose )
        {
            printf( "%2d : Span = %e  ", Iter+1, CostThis );
            printf( "Cut = %6d  (%5.2f %%)  CutR = %6d  ", nCutCur, 100.0*(nCutStart-nCutCur)/nCutStart, nCutCur2 );
            ABC_PRTn( "Total", Abc_Clock() - clk );
            ABC_PRT( "Sort", clk2Total );
//        Frc_ManCrossCutTest( p, vCoOrder );
        }
//        if ( 1.0 * nCutPrev / nCutCur < 1.001 )
//            break;
        nCutPrev = nCutCur;
    }
    ABC_FREE( pHandles );
    ABC_FREE( pVertX );
    Vec_IntFree( vCoOrder );
}